

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FrexpCaseInstance::compare
          (FrexpCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  pointer pSVar2;
  uint uVar3;
  ostream *poVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  ostringstream *this_00;
  int iVar8;
  float fVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  deUint32 u32;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (ulong)*(uint *)((long)&(pSVar2->varType).m_data + 4);
  bVar13 = uVar10 == 2;
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (0 < (int)uVar3) {
    fVar6 = (float)~(-1 << (0x17 - (&DAT_00b5b32c)[uVar10 * 4] & 0x1f));
    uVar11 = 0;
    bVar12 = false;
    do {
      fVar1 = *(float *)((long)*inputs + uVar11 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        uVar10 = (ulong)((uint)fVar1 & 0x807fffff | 0x3f000000);
        iVar5 = ((uint)fVar1 >> 0x17 & 0xff) - 0x7e;
        iVar8 = iVar5;
        if (((uint)fVar1 & 0x7fffff) != 0) {
          iVar8 = -0x7d;
        }
        if (((uint)fVar1 & 0x7f800000) != 0) {
          iVar8 = iVar5;
        }
      }
      else {
        iVar8 = movmskps((int)uVar10,ZEXT416((uint)fVar1));
        uVar10 = (ulong)(uint)(iVar8 << 0x1f);
        iVar8 = 0;
      }
      fVar1 = *(float *)((long)*outputs + uVar11 * 4);
      fVar9 = (float)uVar10;
      if (bVar13 && (this->super_CommonFunctionTestInstance).m_shaderType != SHADERTYPE_FRAGMENT) {
LAB_00842642:
        fVar7 = (float)((int)fVar9 - (int)fVar1);
        if ((uint)fVar9 < (uint)fVar1) {
          fVar7 = (float)-((int)fVar9 - (int)fVar1);
        }
      }
      else if ((fVar1 != 0.0) || (NAN(fVar1))) {
        if ((fVar9 != 0.0) || (NAN(fVar9))) goto LAB_00842642;
        fVar7 = ABS(fVar1);
      }
      else {
        fVar7 = ABS(fVar9);
      }
      if (((uint)fVar6 < (uint)fVar7) || (*(int *)((long)outputs[1] + uVar11 * 4) != iVar8)) {
        this_00 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar4 = (ostream *)std::ostream::operator<<(this_00,(int)uVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
        local_34.value = fVar9;
        poVar4 = anon_unknown_0::operator<<(poVar4,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," with ULP threshold ",0x14);
        local_40.value = (deUint64)(uint)fVar6;
        poVar4 = tcu::Format::Hex<8UL>::toStream(&local_40,poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", got ULP diff ",0xf);
        local_40.value = (deUint64)(uint)fVar7;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar4);
        return bVar12;
      }
      uVar11 = uVar11 + 1;
      bVar12 = uVar3 <= uVar11;
    } while (uVar11 != uVar3);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const bool				transitSupportsSignedZero	= (m_shaderType != glu::SHADERTYPE_FRAGMENT); // executor cannot reliably transit negative zero to fragment stage
		const bool				signedZero					= supportsSignedZero(precision) && transitSupportsSignedZero;

		const int				mantissaBits				= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff					= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const int		out1		= ((const int*)outputs[1])[compNdx];

			float			refOut0;
			int				refOut1;

			frexp(in0, &refOut0, &refOut1);

			const deUint32	ulpDiff0	= signedZero ? getUlpDiff(out0, refOut0) : getUlpDiffIgnoreZeroSign(out0, refOut0);

			if (ulpDiff0 > maxUlpDiff || out1 != refOut1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", " << refOut1 << " with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff0);
				return false;
			}
		}

		return true;
	}